

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int calc_size(adiak_datatype_t *datatype)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = 1;
  do {
    switch(datatype->dtype) {
    case adiak_long:
    case adiak_ulong:
    case adiak_double:
    case adiak_date:
    case adiak_timeval:
    case adiak_version:
    case adiak_string:
    case adiak_catstring:
    case adiak_path:
    case adiak_longlong:
    case adiak_ulonglong:
      iVar4 = 8;
LAB_00102439:
      return iVar4 * iVar6;
    case adiak_int:
    case adiak_uint:
      iVar4 = 4;
      goto LAB_00102439;
    case adiak_range:
    case adiak_set:
    case adiak_list:
      piVar1 = &datatype->num_ref_elements;
      piVar2 = &datatype->num_elements;
      datatype = *datatype->subtype;
      iVar6 = iVar6 * (*piVar1 + *piVar2);
      break;
    case adiak_tuple:
      uVar5 = 0;
      uVar7 = (ulong)(uint)datatype->num_subtypes;
      if (datatype->num_subtypes < 1) {
        uVar7 = uVar5;
      }
      iVar4 = 0;
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar3 = calc_size(datatype->subtype[uVar5]);
        iVar4 = iVar4 + iVar3;
      }
      goto LAB_00102439;
    default:
      iVar4 = -1;
      goto LAB_00102439;
    }
  } while( true );
}

Assistant:

static int calc_size(adiak_datatype_t* datatype)
{
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         return sizeof(int);
      case adiak_double:
         return sizeof(double);
      case adiak_timeval:
         return sizeof(struct timeval *);
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list: {
         int num_elements = datatype->num_elements + datatype->num_ref_elements;
         return (num_elements * calc_size(datatype->subtype[0]));
      }
      case adiak_tuple: {
         int bytes = 0;
         for (int i = 0; i < datatype->num_subtypes; ++i)
            bytes += calc_size(datatype->subtype[i]);
         return bytes;
      }
   }
   return -1;
}